

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O2

void __thiscall ST::string::to_buffer(string *this,wchar_buffer *result)

{
  wchar_buffer local_50;
  
  to_wchar(&local_50,this);
  buffer<wchar_t>::operator=(result,&local_50);
  buffer<wchar_t>::~buffer(&local_50);
  return;
}

Assistant:

void to_buffer(wchar_buffer &result) const
        {
            result = to_wchar();
        }